

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

void __thiscall
mp::LinTerms::
fold_into<gch::small_vector<std::pair<int,double>,256u,std::allocator<std::pair<int,double>>>>
          (LinTerms *this,
          small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  ulong uVar1;
  pair<int,_double> local_30;
  
  gch::detail::small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>::resize_with<>
            (&vec->super_small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>,
             (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size);
  if ((this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
    uVar1 = 0;
    do {
      local_30.first =
           (this->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar1];
      local_30.second =
           (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar1];
      gch::detail::small_vector_base<std::allocator<std::pair<int,double>>,256u>::
      append_element<std::pair<int,double>>
                ((small_vector_base<std::allocator<std::pair<int,double>>,256u> *)vec,&local_30);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                     super_small_vector_data_base<double_*,_unsigned_long>.m_size);
  }
  return;
}

Assistant:

void LinTerms::fold_into(Vec& vec) {
  vec.resize(size());
  for (size_t i=0; i<size(); ++i)
    vec.push_back({ var(i), coef(i) });
}